

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O1

REF_STATUS ref_part_cad_discrete_edge(REF_GRID ref_grid,char *filename)

{
  REF_MPI ref_mpi;
  REF_NODE ref_node;
  REF_FILEPOS RVar1;
  int iVar2;
  uint uVar3;
  REF_STATUS RVar4;
  size_t sVar5;
  __off_t _Var6;
  FILE *__stream;
  undefined8 uVar7;
  char *pcVar8;
  REF_BOOL available;
  REF_INT version;
  REF_FILEPOS next_position;
  REF_LONG ncell;
  REF_INT dim;
  REF_FILEPOS key_pos [156];
  int local_540;
  REF_INT local_53c;
  REF_FILEPOS local_538;
  REF_GLOB local_530;
  REF_CELL *local_528;
  undefined1 local_51c [4];
  REF_FILEPOS local_518 [157];
  
  ref_mpi = ref_grid->mpi;
  ref_node = ref_grid->node;
  local_538 = -1;
  sVar5 = strlen(filename);
  iVar2 = strcmp(filename + (sVar5 - 6),".meshb");
  if (iVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x3f5,
           "ref_part_cad_discrete_edge",3,"expected .meshb extension");
    return 3;
  }
  if (ref_mpi->id == 0) {
    uVar3 = ref_import_meshb_header(filename,&local_53c,local_518);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x3f9,
             "ref_part_cad_discrete_edge",(ulong)uVar3,"header");
      return uVar3;
    }
    __stream = fopen(filename,"r");
    if (__stream == (FILE *)0x0) {
      printf("unable to open %s\n",filename);
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x3fe,
             "ref_part_cad_discrete_edge","unable to open file");
      return 2;
    }
    uVar3 = ref_import_meshb_jump((FILE *)__stream,local_53c,local_518,3,&local_540,&local_538);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x401,
             "ref_part_cad_discrete_edge",(ulong)uVar3,"jump");
      return uVar3;
    }
    if (local_540 == 0) {
      pcVar8 = "meshb missing dimension";
      uVar7 = 0x402;
      goto LAB_00179c30;
    }
    sVar5 = fread(local_51c,4,1,__stream);
    if (sVar5 != 1) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x403,
             "ref_part_cad_discrete_edge","dim",1,sVar5);
      return 1;
    }
  }
  else {
    __stream = (FILE *)0x0;
  }
  uVar3 = ref_mpi_bcast(ref_mpi,&local_53c,1,1);
  if (uVar3 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x406,
           "ref_part_cad_discrete_edge",(ulong)uVar3,"bcast");
    return uVar3;
  }
  uVar3 = ref_cell_free(ref_grid->cell[0]);
  if (uVar3 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x408,
           "ref_part_cad_discrete_edge",(ulong)uVar3,"clear out edge");
    return uVar3;
  }
  local_528 = ref_grid->cell;
  uVar3 = ref_cell_create(local_528,REF_CELL_EDG);
  if (uVar3 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x409,
           "ref_part_cad_discrete_edge",(ulong)uVar3,"edg");
    return uVar3;
  }
  if (ref_grid->mpi->id == 0) {
    uVar3 = ref_import_meshb_jump((FILE *)__stream,local_53c,local_518,5,&local_540,&local_538);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x40e,
             "ref_part_cad_discrete_edge",(ulong)uVar3,"jump");
      return uVar3;
    }
    if ((local_540 != 0) &&
       (RVar4 = ref_part_meshb_long((FILE *)__stream,local_53c,&local_530), RVar4 != 0)) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x410,
             "ref_part_cad_discrete_edge",1,"ncell");
      return 1;
    }
  }
  uVar3 = ref_mpi_bcast(ref_mpi,&local_540,1,1);
  if (uVar3 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x414,
           "ref_part_cad_discrete_edge",(ulong)uVar3,"bcast");
    return uVar3;
  }
  if (local_540 != 0) {
    uVar3 = ref_mpi_bcast(ref_mpi,&local_530,1,2);
    if (uVar3 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x418,
             "ref_part_cad_discrete_edge",(ulong)uVar3,"bcast");
      return uVar3;
    }
    uVar3 = ref_part_meshb_cell_bcast(*local_528,local_530,ref_node,local_53c,(FILE *)__stream);
    RVar1 = local_538;
    if (uVar3 == 0) {
      if (ref_grid->mpi->id == 0) {
        _Var6 = ftello(__stream);
        if (RVar1 != _Var6) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0x41f,"ref_part_cad_discrete_edge","end location",RVar1,_Var6);
          return 1;
        }
        fclose(__stream);
      }
      return 0;
    }
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x41c,
           "ref_part_cad_discrete_edge",(ulong)uVar3,"part cell");
    return uVar3;
  }
  pcVar8 = "no edge available in meshb";
  uVar7 = 0x416;
LAB_00179c30:
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar7,
         "ref_part_cad_discrete_edge",pcVar8);
  return 1;
}

Assistant:

REF_FCN REF_STATUS ref_part_cad_discrete_edge(REF_GRID ref_grid,
                                              const char *filename) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  FILE *file;
  REF_INT version, dim;
  REF_BOOL available;
  REF_FILEPOS next_position = REF_EMPTY;
  REF_FILEPOS key_pos[REF_IMPORT_MESHB_LAST_KEYWORD];
  REF_LONG ncell;
  REF_BOOL verbose = REF_FALSE;
  size_t end_of_string;

  end_of_string = strlen(filename);

  if (strcmp(&filename[end_of_string - 6], ".meshb") != 0)
    RSS(REF_INVALID, "expected .meshb extension");

  file = NULL;
  if (ref_mpi_once(ref_mpi)) {
    RSS(ref_import_meshb_header(filename, &version, key_pos), "header");
    if (verbose) printf("meshb version %d\n", version);
    if (verbose) printf("open %s\n", filename);
    file = fopen(filename, "r");
    if (NULL == (void *)file) printf("unable to open %s\n", filename);
    RNS(file, "unable to open file");
    RSS(ref_import_meshb_jump(file, version, key_pos, 3, &available,
                              &next_position),
        "jump");
    RAS(available, "meshb missing dimension");
    REIS(1, fread((unsigned char *)&dim, 4, 1, file), "dim");
    if (verbose) printf("meshb dim %d\n", dim);
  }
  RSS(ref_mpi_bcast(ref_mpi, &version, 1, REF_INT_TYPE), "bcast");

  RSS(ref_cell_free(ref_grid_edg(ref_grid)), "clear out edge");
  RSS(ref_cell_create(&ref_grid_edg(ref_grid), REF_CELL_EDG), "edg");

  if (ref_grid_once(ref_grid)) {
    RSS(ref_import_meshb_jump(file, version, key_pos, 5, &available,
                              &next_position),
        "jump");
    if (available) {
      RSS(ref_part_meshb_long(file, version, &ncell), "ncell");
      if (verbose) printf("nedge %ld\n", ncell);
    }
  }
  RSS(ref_mpi_bcast(ref_mpi, &available, 1, REF_INT_TYPE), "bcast");

  RAS(available, "no edge available in meshb");

  RSS(ref_mpi_bcast(ref_mpi, &ncell, 1, REF_GLOB_TYPE), "bcast");

  RSS(ref_part_meshb_cell_bcast(ref_grid_edg(ref_grid), ncell, ref_node,
                                version, file),
      "part cell");

  if (ref_grid_once(ref_grid)) {
    REIS(next_position, ftello(file), "end location");
    fclose(file);
  }

  return REF_SUCCESS;
}